

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpo.h
# Opt level: O2

bool __thiscall
lpo::
program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::has_opt(program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,string *name,string *short_name)

{
  bool bVar1;
  anon_class_16_2_e0af5a9c_for__M_pred __pred;
  
  __pred.short_name = short_name;
  __pred.name = name;
  bVar1 = std::
          any_of<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,lpo::program_options<int,double,std::__cxx11::string>::has_opt(std::__cxx11::string_const&,std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                    ((this->m_check_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )&(this->m_check_list)._M_t._M_impl.super__Rb_tree_header,__pred);
  return bVar1;
}

Assistant:

bool
  has_opt(const std::string & name, const std::string & short_name) const
  {
    return std::any_of(std::cbegin(m_check_list), std::cend(m_check_list), [&](const auto & n) {
      return (name == n.first || (!short_name.empty() && short_name == n.second));
    });
  }